

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::updatePrimal(HDual *this,HVector *DSE_Vector)

{
  HDualRHS *this_00;
  HVector *column;
  int iVar1;
  double dVar2;
  double dVar3;
  
  if (this->invertHint != 0) {
    return;
  }
  this_00 = &this->dualRHS;
  HDualRHS::update_primal(this_00,&this->columnBFRT,1.0);
  HDualRHS::update_infeasList(this_00,&this->columnBFRT);
  dVar2 = (this->baseValue[this->rowOut] -
          (&this->baseLower)[0.0 < this->deltaPrimal || this->deltaPrimal == 0.0][this->rowOut]) /
          this->alpha;
  this->thetaPrimal = dVar2;
  column = &this->column;
  HDualRHS::update_primal(this_00,column,dVar2);
  if (this->EdWt_Mode == 1) {
    dVar2 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[this->rowOut] / (this->alpha * this->alpha);
    if (dVar2 <= 1.0) {
      dVar2 = 1.0;
    }
    HDualRHS::update_weight_Dvx(this_00,column,dVar2);
    (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[this->rowOut] = dVar2;
    this->n_dvx_it = this->n_dvx_it + 1;
  }
  else if (this->EdWt_Mode == 0) {
    dVar2 = this->alpha;
    dVar3 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[this->rowOut] / (dVar2 * dVar2);
    HDualRHS::update_weight
              (this_00,column,dVar3,-2.0 / dVar2,
               (DSE_Vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[this->rowOut] = dVar3;
  }
  HDualRHS::update_infeasList(this_00,column);
  iVar1 = this->EdWt_Mode;
  if (iVar1 == 0) {
    dVar2 = (double)this->numRow;
    this->rowdseDensity = this->rowdseDensity * 0.95 + ((double)DSE_Vector->count * 0.05) / dVar2;
  }
  else {
    dVar2 = (double)this->numRow;
  }
  dVar3 = (this->column).fakeTick;
  this->columnDensity = this->columnDensity * 0.95 + ((double)(this->column).count * 0.05) / dVar2;
  dVar3 = dVar3 + this->total_fake;
  this->total_fake = dVar3;
  if (iVar1 == 0) {
    this->total_fake = dVar3 + DSE_Vector->fakeTick;
  }
  dVar2 = (double)(this->column).pseudoTick + this->total_FT_inc_TICK;
  this->total_FT_inc_TICK = dVar2;
  if (iVar1 == 0) {
    this->total_FT_inc_TICK = dVar2 + (double)DSE_Vector->pseudoTick;
  }
  return;
}

Assistant:

void HDual::updatePrimal(HVector *DSE_Vector) {
	if (invertHint)
		return;
	// NB DSE_Vector is only computed if EdWt_Mode == EdWt_Mode_DSE
	// Update - primal and weight
	dualRHS.update_primal(&columnBFRT, 1);
	dualRHS.update_infeasList(&columnBFRT);
	double x_out = baseValue[rowOut];
	double l_out = baseLower[rowOut];
	double u_out = baseUpper[rowOut];
	thetaPrimal = (x_out - (deltaPrimal < 0 ? l_out : u_out)) / alpha;
	dualRHS.update_primal(&column, thetaPrimal);
	if (EdWt_Mode == EdWt_Mode_DSE) {
		double thisEdWt = dualRHS.workEdWt[rowOut] / (alpha * alpha);
		dualRHS.update_weight(&column, thisEdWt, -2 / alpha,
				&DSE_Vector->array[0]);
		dualRHS.workEdWt[rowOut] = thisEdWt;
	} else if (EdWt_Mode == EdWt_Mode_Dvx) {
//	Pivotal row is for the current basis: weights are required for the next basis
//  so have to divide the current (exact) weight by the pivotal value
		double thisEdWt = dualRHS.workEdWt[rowOut] / (alpha * alpha);
		double dvx_wt_o_rowOut = max(1.0, thisEdWt);
//       	      nw_wt  is max(workEdWt[iRow], NewExactWeight*columnArray[iRow]^2);
//				But NewExactWeight is dvx_wt_o_rowOut = max(1.0, dualRHS.workEdWt[rowOut] / (alpha * alpha)) so
//       	      nw_wt = max(workEdWt[iRow], dvx_wt_o_rowOut*columnArray[iRow]^2);
//	Update rest of weights
		dualRHS.update_weight_Dvx(&column, dvx_wt_o_rowOut);
		dualRHS.workEdWt[rowOut] = dvx_wt_o_rowOut;
		n_dvx_it += 1;
	}
	dualRHS.update_infeasList(&column);

	if (EdWt_Mode == EdWt_Mode_DSE) {
		rowdseDensity = 0.95 * rowdseDensity
				+ 0.05 * DSE_Vector->count / numRow;
	}
	columnDensity = 0.95 * columnDensity + 0.05 * column.count / numRow;

	total_fake += column.fakeTick;
	if (EdWt_Mode == EdWt_Mode_DSE) {
		total_fake += DSE_Vector->fakeTick;
	}
	total_FT_inc_TICK += column.pseudoTick;
	if (EdWt_Mode == EdWt_Mode_DSE) {
		total_FT_inc_TICK += DSE_Vector->pseudoTick;
	}
}